

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath * __thiscall
testing::internal::FilePath::RemoveExtension
          (FilePath *__return_storage_ptr__,FilePath *this,char *extension)

{
  bool bVar1;
  string local_88;
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string dot_extension;
  char *extension_local;
  FilePath *this_local;
  
  dot_extension.field_2._8_8_ = extension;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,".",&local_61);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,(char *)dot_extension.field_2._8_8_);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  bVar1 = String::EndsWithCaseInsensitive(&this->pathname_,(string *)local_40);
  if (bVar1) {
    std::__cxx11::string::length();
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)&local_88,(ulong)this);
    FilePath(__return_storage_ptr__,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    FilePath(__return_storage_ptr__,this);
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveExtension(const char* extension) const {
  const std::string dot_extension = std::string(".") + extension;
  if (String::EndsWithCaseInsensitive(pathname_, dot_extension)) {
    return FilePath(pathname_.substr(
        0, pathname_.length() - dot_extension.length()));
  }
  return *this;
}